

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salesman.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
sort_tuples_and_give_result
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *vec)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  __tuple_element_t<1UL,_tuple<int,_int>_> *p_Var4;
  __tuple_element_t<0UL,_tuple<int,_int>_> *p_Var5;
  int local_54;
  int local_50;
  int i_1;
  int j;
  int local_40;
  int i;
  tuple<int,_int> buff;
  vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> sorted_vec;
  vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *vec_local;
  vector<int,_std::allocator<int>_> *vec_results;
  
  std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::vector
            ((vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)&buff);
  std::tuple<int,_int>::tuple<true,_true>((tuple<int,_int> *)&i);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  local_40 = 0;
  do {
    sVar2 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::size(vec);
    if (sVar2 <= (ulong)(long)local_40) {
      for (local_54 = 0;
          sVar2 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::size
                            ((vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *
                             )&buff), (ulong)(long)local_54 < sVar2; local_54 = local_54 + 1) {
        pvVar3 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::
                 operator[]((vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)
                            &buff,(long)local_54);
        p_Var5 = std::get<0ul,int,int>(pvVar3);
        std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,p_Var5);
      }
      std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::~vector
                ((vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)&buff);
      return __return_storage_ptr__;
    }
    if (local_40 == 0) {
      pvVar3 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::operator[]
                         (vec,0);
      std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::push_back
                ((vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)&buff,
                 pvVar3);
    }
    pvVar3 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::operator[]
                       ((vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)
                        &buff,(long)local_40);
    std::tuple<int,_int>::operator=((tuple<int,_int> *)&i,pvVar3);
    for (local_50 = 0;
        sVar2 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::size(vec)
        , (ulong)(long)local_50 < sVar2; local_50 = local_50 + 1) {
      p_Var4 = std::get<1ul,int,int>((tuple<int,_int> *)&i);
      iVar1 = *p_Var4;
      pvVar3 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::operator[]
                         (vec,(long)local_50);
      p_Var5 = std::get<0ul,int,int>(pvVar3);
      if (iVar1 == *p_Var5) {
        pvVar3 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::
                 operator[](vec,(long)local_50);
        std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::push_back
                  ((vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)&buff,
                   pvVar3);
        break;
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

std::vector<int> sort_tuples_and_give_result(std::vector<std::tuple<int,int>> &vec){
    std::vector<std::tuple<int,int>> sorted_vec;
    std::tuple<int,int> buff;
    std::vector<int> vec_results;


    for(int i=0; i<vec.size(); i++){
        if(i==0){
            sorted_vec.push_back(vec[i]);
        }
        buff = sorted_vec[i];
        for(int j=0; j<vec.size();j++){
            if(std::get<1>(buff)==std::get<0>(vec[j])){
                sorted_vec.push_back(vec[j]);
                break;

            }
        }
    }

    for(int i=0; i<sorted_vec.size(); i++){
        vec_results.push_back(std::get<0>(sorted_vec[i]));
    }
    return vec_results;
}